

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O3

int resolve_json_schema_list_predicate(char *predicate,lys_node_list *list,int *parsed)

{
  byte bVar1;
  char *__s1;
  int iVar2;
  ushort **ppuVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  size_t __n;
  char *local_78;
  char *mod_name;
  char *pcStack_68;
  int mod_name_len;
  char *name;
  char *local_58;
  int *local_50;
  int local_48;
  int local_44;
  int nam_len;
  int has_predicate;
  lys_node_list *local_38;
  
  local_50 = parsed;
  nam_len = parse_schema_json_predicate
                      (predicate,&local_78,(int *)((long)&mod_name + 4),&stack0xffffffffffffff98,
                       &local_48,(char **)0x0,(int *)0x0,&local_44);
  if (0 < nam_len) {
    __n = (size_t)local_48;
    iVar2 = strncmp(pcStack_68,".",__n);
    if (iVar2 != 0) {
      *local_50 = *local_50 + nam_len;
      local_58 = predicate;
      local_38 = list;
      ppuVar3 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar3 + (long)*pcStack_68 * 2 + 1) & 8) == 0) {
        bVar1 = local_38->keys_size;
        if (bVar1 == 0) {
          uVar5 = 0;
          uVar4 = (uint)bVar1;
LAB_0011443c:
          if ((uint)uVar5 != uVar4) goto LAB_0011445e;
        }
        else {
          name = (char *)local_38->keys;
          has_predicate = (int)bVar1;
          uVar6 = (ulong)(uint)has_predicate;
          uVar5 = 0;
          do {
            __s1 = (char *)**(undefined8 **)(name + uVar5 * 8);
            iVar2 = strncmp(__s1,pcStack_68,__n);
            if ((iVar2 == 0) && (uVar4 = has_predicate, __s1[__n] == '\0')) goto LAB_0011443c;
            uVar5 = uVar5 + 1;
          } while (uVar6 != uVar5);
        }
        ly_vlog(local_38->module->ctx,LYE_PATH_INKEY,LY_VLOG_NONE,(void *)0x0,pcStack_68);
        return -1;
      }
LAB_0011445e:
      if (local_44 == 0) {
        return 0;
      }
      iVar2 = resolve_json_schema_list_predicate(local_58 + (uint)nam_len,local_38,local_50);
      return iVar2;
    }
  }
  ly_vlog(list->module->ctx,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
          (ulong)(uint)(int)predicate[-(long)nam_len],predicate + -(long)nam_len);
  return -1;
}

Assistant:

static int
resolve_json_schema_list_predicate(const char *predicate, const struct lys_node_list *list, int *parsed)
{
    const char *mod_name, *name;
    int mod_name_len, nam_len, has_predicate, i;
    struct lys_node *key;

    if (((i = parse_schema_json_predicate(predicate, &mod_name, &mod_name_len, &name, &nam_len, NULL, NULL, &has_predicate)) < 1)
            || !strncmp(name, ".", nam_len)) {
        LOGVAL(list->module->ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, predicate[-i], &predicate[-i]);
        return -1;
    }

    predicate += i;
    *parsed += i;

    if (!isdigit(name[0])) {
        for (i = 0; i < list->keys_size; ++i) {
            key = (struct lys_node *)list->keys[i];
            if (!strncmp(key->name, name, nam_len) && !key->name[nam_len]) {
                break;
            }
        }

        if (i == list->keys_size) {
            LOGVAL(list->module->ctx, LYE_PATH_INKEY, LY_VLOG_NONE, NULL, name);
            return -1;
        }
    }

    /* more predicates? */
    if (has_predicate) {
        return resolve_json_schema_list_predicate(predicate, list, parsed);
    }

    return 0;
}